

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3.h
# Opt level: O2

vector3 * vector3::aleatorioEmEsferaUnitaria(void)

{
  vector3 *in_RDI;
  
  do {
    aleatorio(in_RDI,-1.0,1.0);
  } while (1.0 <= in_RDI->e[2] * in_RDI->e[2] +
                  in_RDI->e[0] * in_RDI->e[0] + in_RDI->e[1] * in_RDI->e[1]);
  return in_RDI;
}

Assistant:

static const vector3 aleatorioEmEsferaUnitaria() {
        while(true) {
            vector3 ponto = vector3::aleatorio(-1, 1);
            if (ponto.quadradoComprimento() >= 1) continue;
            return ponto;
        }
    }